

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnData::InitializePrefetch
          (StructColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t rows)

{
  vector<duckdb::ColumnScanState,_true> *this_00;
  reference pvVar1;
  reference this_01;
  pointer pCVar2;
  ulong __n;
  ColumnData *this_02;
  reference rVar3;
  
  this_00 = &scan_state->child_states;
  __n = 0;
  this_02 = (ColumnData *)this_00;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,0);
  ColumnData::InitializePrefetch(this_02,prefetch_state,pvVar1,rows);
  while (__n < (ulong)((long)(this->sub_columns).
                             super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->sub_columns).
                             super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    rVar3 = vector<bool,_true>::get<true>(&scan_state->scan_child_column,__n);
    if ((*rVar3._M_p & rVar3._M_mask) == 0) {
      __n = __n + 1;
    }
    else {
      this_01 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::get<true>(&this->sub_columns,__n);
      pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_01);
      __n = __n + 1;
      pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,__n);
      (*pCVar2->_vptr_ColumnData[6])(pCVar2,prefetch_state,pvVar1,rows);
    }
  }
  return;
}

Assistant:

void StructColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t rows) {
	validity.InitializePrefetch(prefetch_state, scan_state.child_states[0], rows);
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		if (!scan_state.scan_child_column[i]) {
			continue;
		}
		sub_columns[i]->InitializePrefetch(prefetch_state, scan_state.child_states[i + 1], rows);
	}
}